

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  wchar_t x;
  wchar_t y;
  uint uVar2;
  uint uVar3;
  int iVar4;
  loc_conflict lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lStack_80;
  wchar_t ac;
  wchar_t vc;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t *local_60;
  wchar_t *local_58;
  ui_entry_combiner_funcs_conflict combiner;
  
  local_64 = nlabel;
  local_60 = label;
  local_58 = auxvals;
  if (((L'\t' < info->ncolors) && (L'\x03' < info->nlabcolors)) && (L'\x04' < info->nsym)) {
    lVar5.y = 0;
    lVar5.x = (details->value_position).x;
    uVar8 = (ulong)(uint)(details->value_position).y;
    uVar9 = (uint)details->alternate_color_first + (uint)details->alternate_color_first * 4;
    uVar6 = 0;
    uVar7 = 0;
    local_68 = n;
    if (L'\0' < n) {
      uVar7 = (ulong)(uint)n;
    }
    for (; wVar1 = local_64, uVar7 != uVar6; uVar6 = uVar6 + 1) {
      wVar1 = vals[uVar6];
      if (wVar1 == L'\0') {
        uVar2 = 2;
      }
      else if (wVar1 == L'\x7fffffff') {
        uVar2 = 0;
      }
      else if (wVar1 == L'\x7ffffffe') {
        uVar2 = 1;
      }
      else {
        uVar2 = 3;
      }
      uVar3 = uVar2;
      if (((1 < (uint)(local_58[uVar6] + L'\x80000002')) && (local_58[uVar6] != L'\0')) &&
         (uVar3 = 4, wVar1 != L'\0')) {
        uVar3 = uVar2;
      }
      Term_putch(lVar5.x,(wchar_t)uVar8,info->colors[uVar3 + uVar9],info->symbols[uVar3]);
      lVar5 = loc_sum((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar8 << 0x20),
                      (loc_conflict)details->position_step);
      uVar8 = (ulong)lVar5 >> 0x20;
      uVar9 = uVar9 ^ 5;
    }
    if ((L'\0' < local_64) || (details->show_combined == true)) {
      iVar4 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&combiner)
      ;
      if (iVar4 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-entry-renderers.c"
                      ,0x2c6,
                      "void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                     );
      }
      (*combiner.vec_func)(local_68,vals,local_58,&vc,&ac);
      if (L'\0' < wVar1) {
        if (details->known_rune == true) {
          if (((uint)(vc + L'\x80000002') < 2) || (vc == L'\0')) {
            lStack_80 = 1;
            if ((1 < (uint)(ac + L'\x80000002')) && (ac != L'\0')) {
              lStack_80 = 3;
            }
          }
          else {
            lStack_80 = 2;
          }
        }
        else {
          lStack_80 = 0;
        }
        x = (details->label_position).x;
        y = (details->label_position).y;
        if (details->vertical_label == true) {
          for (uVar6 = 0; (uint)wVar1 != uVar6; uVar6 = uVar6 + 1) {
            Term_putch(x,y + (int)uVar6,info->label_colors[lStack_80],local_60[uVar6]);
          }
        }
        else {
          safe_queue_chars(x,y,wVar1,info->label_colors[lStack_80],local_60);
        }
      }
      if (details->show_combined == true) {
        show_combined_generic(info,details,vc,ac);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 10 && info->nlabcolors >= 4 && info->nsym >= 5",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-entry-renderers.c"
                ,0x2a8,
                "void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_COMPACT_FLAG_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 5 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 10 && info->nlabcolors >= 4 && info->nsym >= 5);

	for (i = 0; i < n; ++i) {
		int palette_index = 2;

		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE) {
			palette_index = 0;
		} else if (vals[i] == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
		} else if (vals[i]) {
			palette_index = 3;
		}
		if (auxvals[i] && auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			if (vals[i] == 0) {
				palette_index = 4;
			}
		}
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 5;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index = 1;

		if (! details->known_rune) {
			palette_index = 0;
		} else if (vc && vc != UI_ENTRY_UNKNOWN_VALUE &&
			vc != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 2;
		} else if (ac && ac != UI_ENTRY_UNKNOWN_VALUE &&
			ac != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 3;
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}